

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::NonMaximumSuppression::ByteSizeLong(NonMaximumSuppression *this)

{
  SuppressionMethodCase SVar1;
  ClassLabelsCase CVar2;
  int iVar3;
  long lVar4;
  string *psVar5;
  size_t sVar6;
  double dVar7;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  NonMaximumSuppression *this_local;
  
  sStack_18 = 0;
  confidenceinputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar5 = confidenceinputfeaturename_abi_cxx11_(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sStack_18 + 2;
  }
  coordinatesinputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar5 = coordinatesinputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  iouthresholdinputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar5 = iouthresholdinputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  confidencethresholdinputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar5 = confidencethresholdinputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  confidenceoutputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar5 = confidenceoutputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  coordinatesoutputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar5 = coordinatesoutputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  dVar7 = iouthreshold(this);
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    sStack_18 = sStack_18 + 10;
  }
  dVar7 = confidencethreshold(this);
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    sStack_18 = sStack_18 + 10;
  }
  SVar1 = SuppressionMethod_case(this);
  if ((SVar1 != SUPPRESSIONMETHOD_NOT_SET) && (SVar1 == kPickTop)) {
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NonMaximumSuppression_PickTop>
                      ((this->SuppressionMethod_).picktop_);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  CVar2 = ClassLabels_case(this);
  if (CVar2 != CLASSLABELS_NOT_SET) {
    if (CVar2 == kStringClassLabels) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::StringVector>
                        ((this->ClassLabels_).stringclasslabels_);
      sStack_18 = sVar6 + 2 + sStack_18;
    }
    else if (CVar2 == kInt64ClassLabels) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::Int64Vector>
                        ((this->ClassLabels_).int64classlabels_);
      sStack_18 = sVar6 + 2 + sStack_18;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar3;
  return sStack_18;
}

Assistant:

size_t NonMaximumSuppression::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NonMaximumSuppression)
  size_t total_size = 0;

  // string confidenceInputFeatureName = 200;
  if (this->confidenceinputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->confidenceinputfeaturename());
  }

  // string coordinatesInputFeatureName = 201;
  if (this->coordinatesinputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->coordinatesinputfeaturename());
  }

  // string iouThresholdInputFeatureName = 202;
  if (this->iouthresholdinputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->iouthresholdinputfeaturename());
  }

  // string confidenceThresholdInputFeatureName = 203;
  if (this->confidencethresholdinputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->confidencethresholdinputfeaturename());
  }

  // string confidenceOutputFeatureName = 210;
  if (this->confidenceoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->confidenceoutputfeaturename());
  }

  // string coordinatesOutputFeatureName = 211;
  if (this->coordinatesoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->coordinatesoutputfeaturename());
  }

  // double iouThreshold = 110;
  if (this->iouthreshold() != 0) {
    total_size += 2 + 8;
  }

  // double confidenceThreshold = 111;
  if (this->confidencethreshold() != 0) {
    total_size += 2 + 8;
  }

  switch (SuppressionMethod_case()) {
    // .CoreML.Specification.NonMaximumSuppression.PickTop pickTop = 1;
    case kPickTop: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *SuppressionMethod_.picktop_);
      break;
    }
    case SUPPRESSIONMETHOD_NOT_SET: {
      break;
    }
  }
  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}